

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64_out_32.h
# Opt level: O1

uint32_t __thiscall
PMP_Multilinear_Hasher_64_out_32::_hash_noRecursionNoInline_forLessThan8Chunks
          (PMP_Multilinear_Hasher_64_out_32 *this,uchar *chars,uint cnt)

{
  ULARGE_INTEGER__XX *coeff;
  ULARGE_INTEGER__XX constTerm;
  random_data_for_MPSHF *prVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  uchar *puVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint32_t *puVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar44 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_ZMM24 [64];
  uint64_t ctr;
  uint64_t allValues [8];
  undefined1 local_c0 [8];
  long local_b8;
  ulong uStack_68;
  ulong local_60 [8];
  undefined1 auVar43 [32];
  
  uVar17 = 0;
  if (0x1ff < cnt) {
    prVar1 = this->curr_rd;
    uVar10 = prVar1->const_term;
    puVar9 = chars + 0xf0;
    uVar17 = 0;
    do {
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      lVar21 = 0;
      auVar22 = vpxord_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
      in_ZMM24 = ZEXT1664(auVar22);
      do {
        auVar22 = vpmuludq_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xf0),
                               *(undefined1 (*) [16])(prVar1->random_coeff + lVar21));
        auVar52 = vpsrlq_avx(auVar22,0x20);
        auVar23 = vpaddq_avx512vl(auVar52,in_ZMM24._0_16_);
        auVar22 = vpaddq_avx(auVar22,auVar45._0_16_);
        auVar52 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21),0xf5);
        auVar55 = vpshufd_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xf0),0xf5);
        auVar3 = vpmuludq_avx(auVar55,auVar52);
        auVar51 = vpsrlq_avx(auVar3,0x20);
        auVar4 = vpmuludq_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xe0),
                              *(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 4));
        auVar52 = vpsrlq_avx(auVar4,0x20);
        auVar52 = vpaddq_avx(auVar23,auVar52);
        auVar55 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 4),0xf5);
        auVar23 = vpshufd_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xe0),0xf5);
        auVar23 = vpmuludq_avx(auVar23,auVar55);
        auVar54 = vpsrlq_avx(auVar23,0x20);
        auVar5 = vpmuludq_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xd0),
                              *(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 8));
        auVar55 = vpsrlq_avx(auVar5,0x20);
        auVar55 = vpaddq_avx(auVar51,auVar55);
        auVar52 = vpaddq_avx(auVar52,auVar55);
        auVar55 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 8),0xf5);
        auVar51 = vpshufd_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xd0),0xf5);
        auVar51 = vpmuludq_avx(auVar51,auVar55);
        auVar53 = vpsrlq_avx(auVar51,0x20);
        auVar6 = vpmuludq_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xc0),
                              *(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0xc));
        auVar55 = vpsrlq_avx(auVar6,0x20);
        auVar55 = vpaddq_avx(auVar54,auVar55);
        auVar55 = vpaddq_avx(auVar55,auVar53);
        auVar52 = vpaddq_avx(auVar52,auVar55);
        auVar55 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0xc),0xf5);
        auVar53 = vpshufd_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xc0),0xf5);
        auVar53 = vpmuludq_avx(auVar53,auVar55);
        auVar55 = vpsrlq_avx(auVar53,0x20);
        auVar54 = vpmuludq_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xb0),
                               *(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x10));
        auVar57 = vpsrlq_avx(auVar54,0x20);
        auVar55 = vpaddq_avx(auVar57,auVar55);
        auVar57 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x10),0xf5);
        auVar7 = vpshufd_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xb0),0xf5);
        auVar57 = vpmuludq_avx(auVar7,auVar57);
        auVar56 = vpsrlq_avx(auVar57,0x20);
        auVar7 = vpmuludq_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xa0),
                              *(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x14));
        auVar24 = vpsrlq_avx512vl(auVar7,0x20);
        auVar55 = vpaddq_avx512vl(auVar55,auVar24);
        auVar55 = vpaddq_avx(auVar55,auVar56);
        auVar25 = vpaddq_avx512vl(auVar52,auVar55);
        auVar52 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x14),0xf5);
        auVar55 = vpshufd_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0xa0),0xf5);
        auVar55 = vpmuludq_avx(auVar55,auVar52);
        auVar56 = vpsrlq_avx(auVar55,0x20);
        auVar24 = vpmuludq_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x90),
                               *(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x18));
        auVar52 = vpsrlq_avx512vl(auVar24,0x20);
        auVar26 = vpaddq_avx512vl(auVar52,auVar56);
        auVar52 = vpshufd_avx(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x18),0xf5);
        auVar56 = vpshufd_avx(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x90),0xf5);
        auVar56 = vpmuludq_avx(auVar56,auVar52);
        auVar58 = vpsrlq_avx(auVar56,0x20);
        auVar52 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x1c));
        auVar27 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x80));
        auVar28 = vpmuludq_avx512vl(auVar27,auVar52);
        auVar29 = vpsrlq_avx512vl(auVar28,0x20);
        auVar26 = vpaddq_avx512vl(auVar26,auVar29);
        auVar26 = vpaddq_avx512vl(auVar26,auVar58);
        auVar52 = vpshufd_avx512vl(auVar52,0xf5);
        auVar27 = vpshufd_avx512vl(auVar27,0xf5);
        auVar27 = vpmuludq_avx512vl(auVar27,auVar52);
        auVar52 = vpsrlq_avx512vl(auVar27,0x20);
        auVar29 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x20));
        auVar58 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x70));
        auVar30 = vpmuludq_avx512vl(auVar58,auVar29);
        auVar31 = vpsrlq_avx512vl(auVar30,0x20);
        auVar26 = vpaddq_avx512vl(auVar26,auVar31);
        auVar25 = vpaddq_avx512vl(auVar25,auVar26);
        auVar26 = vpshufd_avx512vl(auVar29,0xf5);
        auVar29 = vpshufd_avx512vl(auVar58,0xf5);
        auVar26 = vpmuludq_avx512vl(auVar29,auVar26);
        auVar29 = vpsrlq_avx512vl(auVar26,0x20);
        auVar58 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x24));
        auVar31 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x60));
        auVar32 = vpmuludq_avx512vl(auVar31,auVar58);
        auVar33 = vpsrlq_avx512vl(auVar32,0x20);
        auVar52 = vpaddq_avx512vl(auVar52,auVar33);
        auVar52 = vpaddq_avx512vl(auVar52,auVar29);
        auVar29 = vpshufd_avx512vl(auVar58,0xf5);
        auVar58 = vpshufd_avx512vl(auVar31,0xf5);
        auVar29 = vpmuludq_avx512vl(auVar58,auVar29);
        auVar58 = vpsrlq_avx512vl(auVar29,0x20);
        auVar31 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x28));
        auVar33 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x50));
        auVar34 = vpmuludq_avx512vl(auVar33,auVar31);
        auVar35 = vpsrlq_avx512vl(auVar34,0x20);
        auVar52 = vpaddq_avx512vl(auVar52,auVar35);
        auVar52 = vpaddq_avx512vl(auVar52,auVar58);
        auVar58 = vpshufd_avx512vl(auVar31,0xf5);
        auVar31 = vpshufd_avx512vl(auVar33,0xf5);
        auVar58 = vpmuludq_avx512vl(auVar31,auVar58);
        auVar31 = vpsrlq_avx512vl(auVar58,0x20);
        auVar33 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x2c));
        auVar35 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x40));
        auVar36 = vpmuludq_avx512vl(auVar35,auVar33);
        auVar37 = vpsrlq_avx512vl(auVar36,0x20);
        auVar52 = vpaddq_avx512vl(auVar52,auVar37);
        auVar52 = vpaddq_avx512vl(auVar25,auVar52);
        auVar25 = vpshufd_avx512vl(auVar33,0xf5);
        auVar33 = vpshufd_avx512vl(auVar35,0xf5);
        auVar25 = vpmuludq_avx512vl(auVar33,auVar25);
        auVar33 = vpsrlq_avx512vl(auVar25,0x20);
        auVar35 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x30));
        auVar37 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x30));
        auVar38 = vpmuludq_avx512vl(auVar37,auVar35);
        auVar39 = vpsrlq_avx512vl(auVar38,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar39);
        auVar31 = vpaddq_avx512vl(auVar31,auVar33);
        auVar33 = vpshufd_avx512vl(auVar35,0xf5);
        auVar35 = vpshufd_avx512vl(auVar37,0xf5);
        auVar33 = vpmuludq_avx512vl(auVar35,auVar33);
        auVar35 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x34));
        auVar37 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x20));
        auVar39 = vpmuludq_avx512vl(auVar37,auVar35);
        auVar40 = vpsrlq_avx512vl(auVar39,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar40);
        auVar40 = vpsrlq_avx512vl(auVar33,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar40);
        auVar35 = vpshufd_avx512vl(auVar35,0xf5);
        auVar37 = vpshufd_avx512vl(auVar37,0xf5);
        auVar35 = vpmuludq_avx512vl(auVar37,auVar35);
        auVar37 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x38));
        auVar40 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4 + -0x10));
        auVar41 = vpmuludq_avx512vl(auVar40,auVar37);
        auVar48 = vpsrlq_avx(auVar41,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar48);
        auVar48 = vpsrlq_avx512vl(auVar35,0x20);
        auVar31 = vpaddq_avx512vl(auVar31,auVar48);
        auVar52 = vpaddq_avx512vl(auVar52,auVar31);
        auVar31 = vpshufd_avx512vl(auVar37,0xf5);
        auVar37 = vpshufd_avx512vl(auVar40,0xf5);
        auVar31 = vpmuludq_avx512vl(auVar37,auVar31);
        auVar37 = vpsrlq_avx512vl(auVar31,0x20);
        auVar40 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(prVar1->random_coeff + lVar21 + 0x3c));
        auVar48 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar9 + lVar21 * 4));
        auVar42 = vpmuludq_avx512vl(auVar48,auVar40);
        auVar49 = vpsrlq_avx(auVar42,0x20);
        auVar37 = vpaddq_avx512vl(auVar49,auVar37);
        auVar40 = vpshufd_avx512vl(auVar40,0xf5);
        auVar48 = vpshufd_avx512vl(auVar48,0xf5);
        auVar40 = vpmuludq_avx512vl(auVar48,auVar40);
        auVar48 = vpsrlq_avx512vl(auVar40,0x20);
        auVar37 = vpaddq_avx512vl(auVar37,auVar48);
        auVar37 = vpaddq_avx512vl(auVar52,auVar37);
        in_ZMM24 = ZEXT1664(auVar37);
        auVar22 = vpaddq_avx(auVar4,auVar22);
        auVar52 = vpaddq_avx(auVar5,auVar3);
        auVar22 = vpaddq_avx(auVar22,auVar52);
        auVar52 = vpaddq_avx(auVar6,auVar23);
        auVar52 = vpaddq_avx(auVar52,auVar51);
        auVar22 = vpaddq_avx(auVar22,auVar52);
        auVar52 = vpaddq_avx(auVar54,auVar53);
        auVar52 = vpaddq_avx(auVar7,auVar52);
        auVar52 = vpaddq_avx(auVar57,auVar52);
        auVar22 = vpaddq_avx(auVar22,auVar52);
        auVar52 = vpaddq_avx(auVar24,auVar55);
        auVar52 = vpaddq_avx(auVar28,auVar52);
        auVar52 = vpaddq_avx(auVar56,auVar52);
        auVar52 = vpaddq_avx512vl(auVar52,auVar30);
        auVar22 = vpaddq_avx(auVar22,auVar52);
        auVar52 = vpaddq_avx512vl(auVar27,auVar32);
        auVar52 = vpaddq_avx512vl(auVar52,auVar26);
        auVar52 = vpaddq_avx512vl(auVar52,auVar34);
        auVar52 = vpaddq_avx512vl(auVar52,auVar29);
        auVar52 = vpaddq_avx512vl(auVar52,auVar36);
        auVar22 = vpaddq_avx(auVar22,auVar52);
        auVar52 = vpaddq_avx512vl(auVar58,auVar38);
        auVar52 = vpaddq_avx512vl(auVar52,auVar25);
        auVar52 = vpaddq_avx512vl(auVar52,auVar39);
        auVar52 = vpaddq_avx512vl(auVar52,auVar33);
        auVar52 = vpaddq_avx(auVar52,auVar41);
        auVar52 = vpaddq_avx512vl(auVar52,auVar35);
        auVar22 = vpaddq_avx(auVar22,auVar52);
        auVar52 = vpaddq_avx512vl(auVar42,auVar31);
        auVar52 = vpaddq_avx512vl(auVar52,auVar40);
        auVar22 = vpaddq_avx(auVar22,auVar52);
        auVar45 = ZEXT1664(auVar22);
        lVar21 = lVar21 + 0x40;
      } while (lVar21 == 0x40);
      auVar52 = vpunpckhqdq_avx512vl(auVar22,auVar37);
      auVar22 = vpunpcklqdq_avx512vl(auVar22,auVar37);
      auVar22 = vpaddq_avx(auVar22,auVar52);
      lVar14 = vpextrq_avx(auVar22,1);
      lVar14 = (ulong)(uint)(auVar22._4_4_ - (int)lVar14) + lVar14;
      uVar19 = lVar14 << 0x20 | auVar22._0_8_ & 0xffffffff;
      uVar20 = uVar19 + uVar10;
      lVar21 = (uVar20 >> 0x20) * 0xf;
      uVar15 = ((int)((ulong)lVar14 >> 0x20) + (uint)CARRY8(uVar19,uVar10)) * 0xe1 +
               (int)((ulong)lVar21 >> 0x20) * 0xf + 0xf;
      uVar18 = (uint)uVar20;
      uVar12 = uVar15 + uVar18;
      uVar11 = (uint)lVar21;
      uVar13 = uVar12 - uVar11;
      uVar19 = (ulong)uVar13;
      iVar8 = (CARRY4(uVar15,uVar18) + 1) - (uint)(uVar12 < uVar11);
      if (uVar13 < 0x1e) {
        if (iVar8 != 0) {
          uVar19 = (ulong)((uVar13 - 0xf) + iVar8 * -0xf);
        }
      }
      else {
        uVar19 = (ulong)(uVar13 + iVar8 * -0xf);
      }
      local_60[uVar17 - 1] = uVar19;
      uVar17 = uVar17 + 1;
      puVar9 = puVar9 + 0x200;
    } while (uVar17 != cnt >> 9);
  }
  uVar15 = cnt & 0x1ff;
  puVar9 = chars + (cnt & 0xfffffe00);
  coeff = (ULARGE_INTEGER__XX *)this->curr_rd + 2;
  constTerm = *(ULARGE_INTEGER__XX *)this->curr_rd;
  if (uVar15 < 4) {
    switch(cnt & 3) {
    case 0:
      uVar10 = 1;
      break;
    case 1:
      uVar10 = (ulong)(puVar9[uVar15 - 1] | 0x100);
      break;
    case 2:
      uVar10 = (ulong)(*(ushort *)(puVar9 + ((ulong)uVar15 - 2)) | 0x10000);
      break;
    case 3:
      uVar10 = (ulong)((uint)puVar9[uVar15 - 1] * 0x10000 + 0x1000000 +
                      (uint)*(ushort *)(puVar9 + ((ulong)uVar15 - 3)));
    }
    uVar10 = uVar10 * (coeff->field_0).LowPart;
    lVar21 = (constTerm.QuadPart + uVar10 >> 0x20) * 0xf;
    local_b8._0_4_ = (uint)CARRY8(constTerm.QuadPart,uVar10);
    uVar11 = (uint)local_b8 * 0xe1 + 0xf + (int)((ulong)lVar21 >> 0x20) * 0xf;
    local_c0._0_4_ = (undefined4)(constTerm.QuadPart + uVar10);
    uVar12 = uVar11 + local_c0._0_4_;
    uVar15 = (uint)lVar21;
    uVar13 = uVar12 - uVar15;
    iVar8 = (CARRY4(uVar11,local_c0._0_4_) + 1) - (uint)(uVar12 < uVar15);
    local_c0 = SUB98(CONCAT54(CONCAT14(CARRY8(constTerm.QuadPart,uVar10),iVar8),uVar13),0);
    if (uVar13 < 0x1e) {
      if (iVar8 == 0) goto LAB_0018595b;
      local_c0._0_4_ = (uVar13 - 0xf) + iVar8 * -0xf;
    }
    else {
      local_c0._0_4_ = iVar8 * -0xf + uVar13;
    }
    local_c0._4_4_ = 0;
  }
  else {
    local_c0 = (undefined1  [8])
               hash_of_beginning_of_string_chunk_type2_noinline
                         (this,(uint32_t *)&coeff->QuadPart,constTerm,puVar9,uVar15);
  }
LAB_0018595b:
  uVar19 = uVar17 & 0xffffffff;
  local_60[uVar19 - 1] = (ulong)local_c0;
  prVar1 = this->curr_rd;
  puVar16 = prVar1[1].random_coeff;
  local_b8 = 0;
  local_c0 = (undefined1  [8])prVar1[1].const_term;
  uVar10 = (ulong)((uint)uVar17 + 1);
  if ((uint)uVar17 < 0x3f) {
    uVar17 = 0;
    lVar21 = 0;
    do {
      local_b8 = local_b8 +
                 (ulong)CARRY8((ulong)local_c0,
                               (ulong)*(uint *)(local_60 + (uVar17 - 1)) * (ulong)puVar16[uVar17]);
      local_c0 = (undefined1  [8])
                 ((long)local_c0 +
                 (ulong)*(uint *)(local_60 + (uVar17 - 1)) * (ulong)puVar16[uVar17]);
      lVar21 = lVar21 + (ulong)puVar16[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar10 != uVar17);
    uVar17 = prVar1[1].cachedSum - lVar21;
  }
  else {
    uVar17 = 0xffffffffffffffff;
    do {
      local_b8 = local_b8 +
                 (ulong)CARRY8((ulong)local_c0,(ulong)*(uint *)(local_60 + uVar17) * (ulong)*puVar16
                              );
      local_c0 = (undefined1  [8])
                 ((long)local_c0 + (ulong)*(uint *)(local_60 + uVar17) * (ulong)*puVar16);
      puVar16 = puVar16 + 1;
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
    if (uVar17 < 0x7f) {
      uVar17 = 0x7f;
      if (0x7f < uVar10) {
        uVar17 = uVar10;
      }
      auVar45 = vpbroadcastq_avx512f();
      auVar50 = ZEXT1664((undefined1  [16])0x0);
      uVar10 = 0;
      auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar47 = vmovdqa64_avx512f(auVar50);
        auVar50 = vpbroadcastq_avx512f();
        auVar50 = vporq_avx512f(auVar50,auVar46);
        uVar20 = vpcmpuq_avx512f(auVar50,auVar45,2);
        auVar43 = vmovdqu32_avx512vl(*(undefined1 (*) [32])puVar16);
        auVar44._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar43._4_4_;
        auVar44._0_4_ = (uint)((byte)uVar20 & 1) * auVar43._0_4_;
        auVar44._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar43._8_4_;
        auVar44._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar43._12_4_;
        auVar44._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar43._16_4_;
        auVar44._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar43._20_4_;
        auVar44._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar43._24_4_;
        auVar44._28_4_ = (uint)(byte)(uVar20 >> 7) * auVar43._28_4_;
        auVar50 = vpmovzxdq_avx512f(auVar44);
        auVar50 = vpaddq_avx512f(auVar47,auVar50);
        uVar10 = uVar10 + 8;
        puVar16 = puVar16 + 8;
      } while (((uVar17 - uVar19) + 7 & 0xfffffffffffffff8) != uVar10);
      auVar45 = vmovdqa64_avx512f(auVar50);
      bVar2 = (bool)((byte)uVar20 & 1);
      auVar46._0_8_ = (ulong)bVar2 * auVar45._0_8_ | (ulong)!bVar2 * auVar47._0_8_;
      bVar2 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar46._8_8_ = (ulong)bVar2 * auVar45._8_8_ | (ulong)!bVar2 * auVar47._8_8_;
      bVar2 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar46._16_8_ = (ulong)bVar2 * auVar45._16_8_ | (ulong)!bVar2 * auVar47._16_8_;
      bVar2 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar46._24_8_ = (ulong)bVar2 * auVar45._24_8_ | (ulong)!bVar2 * auVar47._24_8_;
      bVar2 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar46._32_8_ = (ulong)bVar2 * auVar45._32_8_ | (ulong)!bVar2 * auVar47._32_8_;
      bVar2 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar46._40_8_ = (ulong)bVar2 * auVar45._40_8_ | (ulong)!bVar2 * auVar47._40_8_;
      bVar2 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar46._48_8_ = (ulong)bVar2 * auVar45._48_8_ | (ulong)!bVar2 * auVar47._48_8_;
      auVar46._56_8_ =
           (uVar20 >> 7) * auVar45._56_8_ | (ulong)!SUB81(uVar20 >> 7,0) * auVar47._56_8_;
      auVar43 = vextracti64x4_avx512f(auVar46,1);
      auVar45 = vpaddq_avx512f(auVar46,ZEXT3264(auVar43));
      auVar22 = vpaddq_avx(auVar45._0_16_,auVar45._16_16_);
      auVar52 = vpshufd_avx(auVar22,0xee);
      auVar22 = vpaddq_avx(auVar22,auVar52);
      uVar17 = auVar22._0_8_;
    }
    else {
      uVar17 = 0;
    }
  }
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar17;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = prVar1->const_term;
  _local_c0 = auVar22 * auVar52 + _local_c0;
  uVar11 = (uint)local_b8 * 0xe1 + 0xf + (int)((ulong)(uint)local_c0._4_4_ * 0xf >> 0x20) * 0xf;
  uVar12 = uVar11 + local_c0._0_4_;
  uVar15 = (uint)((ulong)(uint)local_c0._4_4_ * 0xf);
  uVar13 = uVar12 - uVar15;
  iVar8 = (CARRY4(uVar11,local_c0._0_4_) + 1) - (uint)(uVar12 < uVar15);
  local_c0._4_4_ = iVar8;
  local_c0._0_4_ = uVar13;
  if (uVar13 < 0x1e) {
    if (iVar8 == 0) goto LAB_00185b28;
    local_c0._0_4_ = (uVar13 - 0xf) + iVar8 * -0xf;
  }
  else {
    local_c0._0_4_ = iVar8 * -0xf + uVar13;
  }
  local_c0._4_4_ = 0;
LAB_00185b28:
  if ((ulong)local_c0 >> 0x20 == 0) {
    uVar15 = ((uint)((ulong)local_c0 >> 0xd) & 0x7ffff ^ local_c0._0_4_) * -0x54c41ab1;
    local_c0 = (undefined1  [8])(ulong)(uVar15 >> 0x10 ^ uVar15);
  }
  return SUB84(local_c0,0);
}

Assistant:

NOINLINE uint32_t _hash_noRecursionNoInline_forLessThan8Chunks(const unsigned char* chars, unsigned int cnt) const
  {
			uint64_t allValues[ 8 ];
			uint64_t tmp_hash;
			unsigned int i;
			// process full chunks
			for ( i=0; i<(cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2); i++ )
			{
				allValues[ i ] = hash_of_string_chunk_compact( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), ((const uint32_t*)(chars)) + ( i << PMPML_CHUNK_SIZE_LOG2 ) );
			}
			// process remaining incomplete chunk(s)
			// note: if string size is a multiple of chunk size, we create a new chunk (1,0,0,...0),
			// so THIS PROCESSING IS ALWAYS PERFORMED
			unsigned int tailCnt = cnt & ( PMPML_CHUNK_SIZE_BYTES - 1 );
			const unsigned char* tail = chars + ( (cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2) << PMPML_CHUNK_SIZE_BYTES_LOG2 );
			if ( tailCnt < 4 )
				allValues[ i ] = hash_of_beginning_of_string_chunk_size03( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );
			else
				allValues[ i ] = hash_of_beginning_of_string_chunk_type2_noinline( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );
//			allValues[ i ] = hash_of_beginning_of_string_chunk_type2( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt );

			tmp_hash = hash_of_num_chunk_incomplete( curr_rd[ 1 ].random_coeff,
							*(ULARGE_INTEGER__XX*)(&(curr_rd[1].const_term)),
							*(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)),
							*(ULARGE_INTEGER__XX*)(&(curr_rd[1].cachedSum)),
							allValues,
							i+1);

			if ( ( tmp_hash >> 32 ) == 0 ) //LIKELY
			{
				return fmix32_short( (uint32_t)tmp_hash );
			}
			return (uint32_t)tmp_hash;
  }